

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_draw_list_add_text
               (nk_draw_list *list,nk_user_font *font,nk_rect rect,char *text,int len,
               float font_height,nk_color fg)

{
  nk_vec2 a;
  nk_vec2 c;
  nk_rune nVar1;
  nk_rune nVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  nk_rune next;
  nk_rune unicode;
  nk_user_font_glyph g;
  nk_rune local_98;
  nk_rune local_94;
  nk_user_font *local_90;
  nk_color local_84;
  float local_80;
  int local_7c;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  nk_user_font_glyph local_58;
  
  local_94 = 0;
  local_98 = 0;
  if ((((text != (char *)0x0) && (list != (nk_draw_list *)0x0)) && (len != 0)) &&
     (((fVar5 = (list->clip_rect).x, fVar5 < rect.x + rect.w &&
       (rect.x < fVar5 + (list->clip_rect).w)) &&
      ((fVar5 = (list->clip_rect).y, fVar5 < rect.h + rect.y &&
       (rect.y < fVar5 + (list->clip_rect).h)))))) {
    unique0x1000003d = in_XMM0_Dc;
    local_78 = (undefined1  [8])rect._0_8_;
    unique0x10000041 = in_XMM0_Dd;
    local_90 = font;
    local_80 = font_height;
    nk_draw_list_push_image(list,font->texture);
    iVar3 = nk_utf_decode(text,&local_94,len);
    if (0 < len && iVar3 != 0) {
      local_84 = (nk_color)
                 ((uint)fg & 0xffffff |
                 (int)((float)((uint)fg >> 0x18) * (list->config).global_alpha) << 0x18);
      local_68 = local_78;
      uStack_60 = uStack_70;
      iVar4 = 0;
      while (nVar2 = local_94, local_94 != 0xfffd) {
        local_7c = nk_utf_decode(text + (long)iVar3 + (long)iVar4,&local_98,len - iVar4);
        nVar1 = local_98;
        if (local_98 == 0xfffd) {
          nVar1 = 0;
        }
        (*local_90->query)(local_90->userdata,local_80,&local_58,nVar2,nVar1);
        fVar5 = local_58.offset.x + (float)local_68;
        fVar6 = local_58.offset.y + (float)local_78._4_4_;
        local_68 = CONCAT44(local_68._4_4_,(float)local_68 + local_58.xadvance);
        a.y = fVar6;
        a.x = fVar5;
        c.y = local_58.height + fVar6;
        c.x = local_58.width + fVar5;
        nk_draw_list_push_rect_uv(list,a,c,local_58.uv[0],local_58.uv[1],local_84);
        iVar4 = iVar3 + iVar4;
        local_94 = local_98;
        if (len <= iVar4) {
          return;
        }
        iVar3 = local_7c;
        if (local_7c == 0) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_add_text(struct nk_draw_list *list, const struct nk_user_font *font,
struct nk_rect rect, const char *text, int len, float font_height,
struct nk_color fg)
{
float x = 0;
int text_len = 0;
nk_rune unicode = 0;
nk_rune next = 0;
int glyph_len = 0;
int next_glyph_len = 0;
struct nk_user_font_glyph g;

NK_ASSERT(list);
if (!list || !len || !text) return;
if (!NK_INTERSECT(rect.x, rect.y, rect.w, rect.h,
list->clip_rect.x, list->clip_rect.y, list->clip_rect.w, list->clip_rect.h)) return;

nk_draw_list_push_image(list, font->texture);
x = rect.x;
glyph_len = nk_utf_decode(text, &unicode, len);
if (!glyph_len) return;

/* draw every glyph image */
fg.a = (nk_byte)((float)fg.a * list->config.global_alpha);
while (text_len < len && glyph_len) {
float gx, gy, gh, gw;
float char_width = 0;
if (unicode == NK_UTF_INVALID) break;

/* query currently drawn glyph information */
next_glyph_len = nk_utf_decode(text + text_len + glyph_len, &next, (int)len - text_len);
font->query(font->userdata, font_height, &g, unicode,
(next == NK_UTF_INVALID) ? '\0' : next);

/* calculate and draw glyph drawing rectangle and image */
gx = x + g.offset.x;
gy = rect.y + g.offset.y;
gw = g.width; gh = g.height;
char_width = g.xadvance;
nk_draw_list_push_rect_uv(list, nk_vec2(gx,gy), nk_vec2(gx + gw, gy+ gh),
g.uv[0], g.uv[1], fg);

/* offset next glyph */
text_len += glyph_len;
x += char_width;
glyph_len = next_glyph_len;
unicode = next;
}
}